

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_common.h
# Opt level: O2

void __thiscall TestSuite::reportTestResult(TestSuite *this,string *test_name,int result)

{
  ulong uVar1;
  string *psVar2;
  char *pcVar3;
  double dVar4;
  undefined1 auVar5 [16];
  string res_msg;
  string time_str;
  char msg_buf [1024];
  
  auVar5 = std::chrono::_V2::system_clock::now();
  dVar4 = ((double)(auVar5._0_8_ - (this->startTimeLocal).__d.__r) / 1000000000.0) * 1000000.0;
  uVar1 = (ulong)dVar4;
  usToString_abi_cxx11_
            (&time_str,
             (TestSuite *)((long)(dVar4 - 9.223372036854776e+18) & (long)uVar1 >> 0x3f | uVar1),
             auVar5._8_8_);
  psVar2 = getResMsg_abi_cxx11_();
  std::__cxx11::string::string((string *)&res_msg,(string *)psVar2);
  pcVar3 = ": ";
  if (res_msg._M_string_length == 0) {
    pcVar3 = "";
  }
  sprintf(msg_buf,"%s (\x1b[33m%s\x1b[0m)%s%s",(test_name->_M_dataplus)._M_p,
          time_str._M_dataplus._M_p,pcVar3,res_msg._M_dataplus._M_p);
  if (result < 0) {
    printf("[ \x1b[31mFAIL\x1b[0m ] %s\n",msg_buf);
    this->cntFail = this->cntFail + 1;
  }
  else {
    if ((((this->options).printTestMessage == false) && (this->displayMsg != true)) ||
       (this->suppressMsg != false)) {
      printf("\x1b[1A");
      putchar(0xd);
    }
    else {
      printf("\x1b[1;30m   === TEST MESSAGE (END) ===\n\x1b[0m");
    }
    printf("[ \x1b[32mPASS\x1b[0m ] %s\n",msg_buf);
    this->cntPass = this->cntPass + 1;
    if (result == 0) goto LAB_0014eee2;
  }
  if (((this->options).abortOnFailure != false) || (this->forceAbortOnFailure == true)) {
    abort();
  }
LAB_0014eee2:
  psVar2 = getTestName_abi_cxx11_();
  psVar2->_M_string_length = 0;
  *(psVar2->_M_dataplus)._M_p = '\0';
  std::__cxx11::string::~string((string *)&res_msg);
  std::__cxx11::string::~string((string *)&time_str);
  return;
}

Assistant:

void reportTestResult(const std::string& test_name,
                          int result)
    {
        std::chrono::time_point<std::chrono::system_clock> cur_time =
                std::chrono::system_clock::now();;
        std::chrono::duration<double> elapsed = cur_time - startTimeLocal;
        std::string time_str = usToString
                               ( (uint64_t)(elapsed.count() * 1000000) );

        char msg_buf[1024];
        std::string res_msg = TestSuite::getResMsg();
        sprintf(msg_buf, "%s (" _CL_BROWN("%s") ")%s%s",
                test_name.c_str(),
                time_str.c_str(),
                (res_msg.empty() ? "" : ": "),
                res_msg.c_str() );

        if (result < 0) {
            printf("[ " _CL_RED("FAIL") " ] %s\n", msg_buf);
            cntFail++;
        } else {
            if ( (options.printTestMessage || displayMsg) &&
                 !suppressMsg ) {
                printf(_CL_D_GRAY("   === TEST MESSAGE (END) ===\n"));
            } else {
                // Move a line up.
                printf("\033[1A");
                // Clear current line.
                printf("\r");
                // And then overwrite.
            }
            printf("[ " _CL_GREEN("PASS") " ] %s\n", msg_buf);
            cntPass++;
        }

        if ( result != 0 &&
             (options.abortOnFailure || forceAbortOnFailure) ) {
            abort();
        }
        getTestName().clear();
    }